

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_reader.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  KernelExecutionType KVar2;
  uint64_t uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  KernelPerformanceInfo *pKVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  char cVar12;
  uint uVar13;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double local_a0;
  int local_98;
  allocator<char> local_91;
  char **local_90;
  vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  kernelInfo;
  KernelPerformanceInfo *new_kernel;
  double fileExecuteTime;
  long local_58;
  string local_50;
  ulong uVar14;
  
  local_90 = argv;
  if (argc != 1) {
    cVar12 = ' ';
    local_98 = 0;
    iVar10 = 1;
    while( true ) {
      lVar8 = (long)iVar10;
      if ((argc <= iVar10) || (pcVar9 = local_90[lVar8], *pcVar9 != '-')) break;
      iVar5 = strcmp(pcVar9,"--delimiter");
      if (iVar5 == 0) {
        lVar8 = (long)iVar10;
        iVar10 = iVar10 + 1;
        pcVar9 = local_90[lVar8 + 1];
        cVar12 = *pcVar9;
      }
      iVar5 = strcmp(pcVar9,"--fixed-width");
      if (iVar5 == 0) {
        lVar8 = (long)iVar10;
        iVar10 = iVar10 + 1;
        local_98 = atoi(local_90[lVar8 + 1]);
      }
      iVar10 = iVar10 + 1;
    }
    kernelInfo.
    super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    kernelInfo.
    super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    kernelInfo.
    super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58 = (long)argc;
    local_a0 = 0.0;
    for (; lVar8 < local_58; lVar8 = lVar8 + 1) {
      __stream = fopen(local_90[lVar8],"rb");
      fileExecuteTime = 0.0;
      fread(&fileExecuteTime,8,1,__stream);
      local_a0 = local_a0 + fileExecuteTime;
      while( true ) {
        iVar10 = feof(__stream);
        if (iVar10 != 0) break;
        pKVar7 = (KernelPerformanceInfo *)operator_new(0x48);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_91);
        KokkosTools::KernelTimer::KernelPerformanceInfo::KernelPerformanceInfo
                  (pKVar7,&local_50,PARALLEL_FOR);
        std::__cxx11::string::~string((string *)&local_50);
        new_kernel = pKVar7;
        bVar4 = KokkosTools::KernelTimer::KernelPerformanceInfo::readFromFile
                          (pKVar7,(FILE *)__stream);
        if ((bVar4) && ((new_kernel->kernelName)._M_string_length != 0)) {
          uVar6 = KokkosTools::KernelTimer::find_index(&kernelInfo,&new_kernel->kernelName);
          if ((int)uVar6 < 0) {
            std::
            vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
            ::push_back(&kernelInfo,&new_kernel);
          }
          else {
            pKVar7 = kernelInfo.
                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6];
            dVar15 = new_kernel->time;
            pKVar7->time = pKVar7->time + dVar15;
            pKVar7->timeSq = dVar15 * dVar15 + pKVar7->timeSq;
            pKVar7->callCount = pKVar7->callCount + new_kernel->callCount;
          }
        }
      }
      fclose(__stream);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>>
              ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )kernelInfo.
                 super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )kernelInfo.
                 super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<bool_(*)(KokkosTools::KernelTimer::KernelPerformanceInfo_*,_KokkosTools::KernelTimer::KernelPerformanceInfo_*)>
                )0x103ba9);
    lVar8 = 0;
    dVar15 = 0.0;
    for (uVar6 = 0;
        (ulong)uVar6 <
        (ulong)((long)kernelInfo.
                      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)kernelInfo.
                      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      pKVar7 = kernelInfo.
               super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6];
      if (pKVar7->kType != REGION) {
        dVar15 = dVar15 + pKVar7->time;
        lVar8 = lVar8 + pKVar7->callCount;
      }
    }
    uVar6 = 0;
    printf(
          " (Type)   Total Time, Call Count, Avg. Time per Call, %%Total Time in Kernels, %%Total Program Time\n"
          );
    puts("-------------------------------------------------------------------------\n");
    puts("Regions: \n");
    uVar13 = (uint)cVar12;
    uVar14 = (ulong)uVar13;
    while( true ) {
      if ((ulong)((long)kernelInfo.
                        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)kernelInfo.
                        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar6) break;
      pKVar7 = kernelInfo.
               super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6];
      if (pKVar7->kType == REGION) {
        uVar3 = pKVar7->callCount;
        auVar16._8_4_ = (int)(uVar3 >> 0x20);
        auVar16._0_8_ = uVar3;
        auVar16._12_4_ = 0x45300000;
        dVar1 = pKVar7->time;
        if (local_98 == 0) {
          pcVar11 = "- %s\n%s%c%f%c%lu%c%f%c%f%c%f\n";
          pcVar9 = " (REGION)  ";
        }
        else {
          pcVar11 = "- %100s\n%11s%c%15.5f%c%12lu%c%15.5f%c%7.3f%c%7.3f\n";
          pcVar9 = " (Region)  ";
        }
        printf(pcVar11,dVar1,
               dVar1 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)),
               (dVar1 / dVar15) * 100.0,(dVar1 / local_a0) * 100.0,
               (pKVar7->kernelName)._M_dataplus._M_p,pcVar9,uVar14,(ulong)uVar13,uVar3,uVar14,uVar14
               ,uVar14);
      }
      uVar6 = uVar6 + 1;
    }
    putchar(10);
    puts("-------------------------------------------------------------------------");
    puts("Kernels: \n");
    uVar6 = 0;
    while( true ) {
      if ((ulong)((long)kernelInfo.
                        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)kernelInfo.
                        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar6) break;
      pKVar7 = kernelInfo.
               super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6];
      uVar3 = pKVar7->callCount;
      auVar17._8_4_ = (int)(uVar3 >> 0x20);
      auVar17._0_8_ = uVar3;
      auVar17._12_4_ = 0x45300000;
      KVar2 = pKVar7->kType;
      if (KVar2 != REGION) {
        if (local_98 == 0) {
          pcVar9 = " (ParFor)  ";
          if (KVar2 != PARALLEL_FOR) {
            if (KVar2 == PARALLEL_REDUCE) {
              pcVar9 = " (ParRed)  ";
            }
            else {
              pcVar9 = " (REGION)  ";
              if (KVar2 == PARALLEL_SCAN) {
                pcVar9 = " (ParScan) ";
              }
            }
          }
          dVar1 = pKVar7->time;
          pcVar11 = "- %s\n%s%c%f%c%lu%c%f%c%f%c%f\n";
        }
        else {
          pcVar9 = " (ParFor)  ";
          if (KVar2 != PARALLEL_FOR) {
            if (KVar2 == PARALLEL_REDUCE) {
              pcVar9 = " (ParRed)  ";
            }
            else {
              pcVar9 = " (Region)  ";
              if (KVar2 == PARALLEL_SCAN) {
                pcVar9 = " (ParScan) ";
              }
            }
          }
          dVar1 = pKVar7->time;
          pcVar11 = "- %100s\n%11s%c%15.5f%c%12lu%c%15.5f%c%7.3f%c%7.3f\n";
        }
        printf(pcVar11,dVar1,
               dVar1 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)),
               (dVar1 / dVar15) * 100.0,(dVar1 / local_a0) * 100.0,
               (pKVar7->kernelName)._M_dataplus._M_p,pcVar9,uVar14,(ulong)uVar13,uVar3,uVar14,uVar14
               ,uVar14);
      }
      uVar6 = uVar6 + 1;
    }
    putchar(10);
    puts("-------------------------------------------------------------------------");
    puts("Summary:");
    putchar(10);
    printf("Total Execution Time (incl. Kokkos + non-Kokkos):      %20.5f seconds\n",local_a0);
    printf("Total Time in Kokkos kernels:                          %20.5f seconds\n",dVar15);
    printf("   -> Time outside Kokkos kernels:                     %20.5f seconds\n",
           local_a0 - dVar15);
    printf("   -> Percentage in Kokkos kernels:                    %20.2f %%\n",
           (dVar15 / local_a0) * 100.0);
    printf("Total Calls to Kokkos Kernels:                         %20lu\n",lVar8);
    putchar(10);
    puts("-------------------------------------------------------------------------");
    std::
    _Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ::~_Vector_base(&kernelInfo.
                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   );
    return 0;
  }
  fwrite("Did you specify any data files on the command line!\n",0x34,1,_stderr);
  fwrite("Usage: ./reader file1.dat [fileX.dat]*\n",0x27,1,_stderr);
  exit(-1);
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc == 1) {
    fprintf(stderr, "Did you specify any data files on the command line!\n");
    fprintf(stderr, "Usage: ./reader file1.dat [fileX.dat]*\n");
    exit(-1);
  }

  char delimiter  = ' ';
  int fixed_width = 0;

  int commandline_args = 1;
  while ((commandline_args < argc) && (argv[commandline_args][0] == '-')) {
    if (strcmp(argv[commandline_args], "--delimiter") == 0) {
      delimiter = argv[++commandline_args][0];
    }
    if (strcmp(argv[commandline_args], "--fixed-width") == 0) {
      fixed_width = atoi(argv[++commandline_args]);
    }

    commandline_args++;
  }

  std::vector<KernelPerformanceInfo*> kernelInfo;
  double totalKernelsTime    = 0;
  double totalExecuteTime    = 0;
  uint64_t totalKernelsCalls = 0;

  for (int i = commandline_args; i < argc; i++) {
    FILE* the_file = fopen(argv[i], "rb");

    double fileExecuteTime = 0;
    fread(&fileExecuteTime, sizeof(fileExecuteTime), 1, the_file);

    totalExecuteTime += fileExecuteTime;

    while (!feof(the_file)) {
      KernelPerformanceInfo* new_kernel =
          new KernelPerformanceInfo("", PARALLEL_FOR);
      if (new_kernel->readFromFile(the_file)) {
        if (!new_kernel->getName().empty()) {
          int kernelIndex = find_index(kernelInfo, new_kernel->getName());

          if (kernelIndex > -1) {
            kernelInfo[kernelIndex]->addTime(new_kernel->getTime());
            kernelInfo[kernelIndex]->addCallCount(new_kernel->getCallCount());
          } else {
            kernelInfo.push_back(new_kernel);
          }
        }
      }
    }

    fclose(the_file);
  }

  std::sort(kernelInfo.begin(), kernelInfo.end(), compareKernelPerformanceInfo);

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    if (kernelInfo[i]->getKernelType() != REGION) {
      totalKernelsTime += kernelInfo[i]->getTime();
      totalKernelsCalls += kernelInfo[i]->getCallCount();
    }
  }

  printf(
      " (Type)   Total Time, Call Count, Avg. Time per Call, %%Total Time in "
      "Kernels, %%Total Program Time\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n\n");

  printf("Regions: \n\n");

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    const double callCountDouble = (double)kernelInfo[i]->getCallCount();

    if (kernelInfo[i]->getKernelType() != REGION) continue;
    if (fixed_width)
      printf("- %100s\n%11s%c%15.5f%c%12" PRIu64 "%c%15.5f%c%7.3f%c%7.3f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (Region)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
    else
      printf("- %s\n%s%c%f%c%" PRIu64 "%c%f%c%f%c%f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (REGION)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
  }

  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");
  printf("Kernels: \n\n");

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    const double callCountDouble = (double)kernelInfo[i]->getCallCount();

    if (kernelInfo[i]->getKernelType() == REGION) continue;
    if (fixed_width)
      printf("- %100s\n%11s%c%15.5f%c%12" PRIu64 "%c%15.5f%c%7.3f%c%7.3f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (Region)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
    else
      printf("- %s\n%s%c%f%c%" PRIu64 "%c%f%c%f%c%f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (REGION)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
  }

  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");
  printf("Summary:\n");
  printf("\n");
  printf(
      "Total Execution Time (incl. Kokkos + non-Kokkos):      %20.5f seconds\n",
      totalExecuteTime);
  printf(
      "Total Time in Kokkos kernels:                          %20.5f seconds\n",
      totalKernelsTime);
  printf(
      "   -> Time outside Kokkos kernels:                     %20.5f seconds\n",
      (totalExecuteTime - totalKernelsTime));
  printf("   -> Percentage in Kokkos kernels:                    %20.2f %%\n",
         (totalKernelsTime / totalExecuteTime) * 100);
  printf("Total Calls to Kokkos Kernels:                         %20" PRIu64
         "\n",
         totalKernelsCalls);
  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");

  return 0;
}